

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

int32_t icu_63::Transliterator::countAvailableVariants(UnicodeString *source,UnicodeString *target)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode ec;
  Mutex lock;
  UErrorCode local_1c;
  Mutex local_18;
  
  local_18.fMutex = &registryMutex;
  umtx_lock_63(&registryMutex);
  local_1c = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(&local_1c);
    if (UVar1 == '\0') {
      iVar2 = 0;
      goto LAB_002727ca;
    }
  }
  iVar2 = _countAvailableVariants(source,target);
LAB_002727ca:
  Mutex::~Mutex(&local_18);
  return iVar2;
}

Assistant:

int32_t U_EXPORT2 Transliterator::countAvailableVariants(const UnicodeString& source,
                                               const UnicodeString& target) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    return HAVE_REGISTRY(ec) ? _countAvailableVariants(source, target) : 0;
}